

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create.cpp
# Opt level: O2

bool __thiscall
create::Create::defineSong
          (Create *this,uint8_t *songNumber,uint8_t *songLength,uint8_t *notes,float *durations)

{
  ulong __n;
  float fVar1;
  ulong uVar2;
  ssize_t sVar3;
  byte bVar4;
  undefined1 uVar5;
  int __flags;
  allocator_type local_49;
  vector<unsigned_char,_std::allocator<unsigned_char>_> cmd;
  
  __flags = (int)durations;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&cmd,(ulong)*songLength * 2 + 3,&local_49);
  *cmd.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start = 0x8c;
  cmd.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[1] = *songNumber;
  bVar4 = *songLength;
  cmd.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[2] = bVar4;
  uVar5 = 0;
  for (uVar2 = 3; __n = (ulong)bVar4 * 2 + 3, uVar2 < __n; uVar2 = uVar2 + 2) {
    fVar1 = *(float *)((long)durations + uVar2 * 2 + -6);
    if ((fVar1 < 0.0) || (4.0 <= fVar1)) goto LAB_0014491d;
    cmd.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[uVar2] = *notes;
    cmd.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[uVar2 + 1] = (uchar)(int)(fVar1 * 64.0);
    bVar4 = *songLength;
    notes = notes + 1;
  }
  sVar3 = Serial::send((this->serial).super___shared_ptr<create::Serial,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,(int)cmd.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                       (void *)(ulong)(uint)((int)cmd.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (int)cmd.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start),__n,
                       __flags);
  uVar5 = (undefined1)sVar3;
LAB_0014491d:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&cmd.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return (bool)uVar5;
}

Assistant:

bool Create::defineSong(const uint8_t& songNumber,
                          const uint8_t& songLength,
                          const uint8_t* notes,
                          const float* durations) const {
    int i, j;
    uint8_t duration;
    std::vector<uint8_t> cmd(2 * songLength + 3);
    cmd[0] = OC_SONG;
    cmd[1] = songNumber;
    cmd[2] = songLength;
    j = 0;
    for (i = 3; i < 2 * songLength + 3; i = i + 2) {
      if (durations[j] < 0 || durations[j] >= 4)
        return false;
      duration = durations[j] * 64;
      cmd[i] = notes[j];
      cmd[i + 1] = duration;
      j++;
    }

    return serial->send(cmd.data(), cmd.size());
  }